

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_option<std::__cxx11::string>
          (App *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *variable,string *description)

{
  Option *this_00;
  allocator local_b1;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  string local_90;
  string local_70;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_50;
  string local_30;
  
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:313:31)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:313:31)>
             ::_M_manager;
  local_b0._M_unused._M_object = variable;
  ::std::__cxx11::string::string((string *)&local_30,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_50,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_b0);
  ::std::__cxx11::string::string((string *)&local_70,(string *)description);
  this_00 = add_option(this,&local_30,&local_50,&local_70,false);
  ::std::__cxx11::string::~string((string *)&local_70);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::string((string *)&local_90,"TEXT",&local_b1);
  Option::set_custom_option(this_00,&local_90,-1);
  ::std::__cxx11::string::~string((string *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  return this_00;
}

Assistant:

Option *add_option(std::string name,
                       std::vector<T> &variable, ///< The variable vector to set
                       std::string description = "") {

        CLI::callback_t fun = [&variable](CLI::results_t res) {
            bool retval = true;
            variable.clear();
            for(const auto &a : res) {
                variable.emplace_back();
                retval &= detail::lexical_cast(a, variable.back());
            }
            return (!variable.empty()) && retval;
        };

        Option *opt = add_option(name, fun, description, false);
        opt->set_custom_option(detail::type_name<T>(), -1);
        return opt;
    }